

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::VerifyAllElementsAndMatchersAreMatched
          (UnorderedElementsAreMatcherImplBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchMatrix *matrix,MatchResultListener *listener)

{
  byte *pbVar1;
  long *plVar2;
  pointer pbVar3;
  ulong uVar4;
  pointer pcVar5;
  MatchResultListener *pMVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  char *sep;
  vector<char,_std::allocator<char>_> matcher_matched;
  vector<char,_std::allocator<char>_> element_matched;
  char *local_78;
  char *local_70;
  vector<char,_std::allocator<char>_> local_68;
  vector<char,_std::allocator<char>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_38 = element_printouts;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50,*(size_type *)matrix,(value_type *)&local_68,(allocator_type *)&local_78);
  local_78 = (char *)((ulong)local_78 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68,*(size_type *)(matrix + 8),(value_type *)&local_78,
             (allocator_type *)&local_70);
  if (*(long *)matrix != 0) {
    uVar4 = 0;
    do {
      uVar8 = *(ulong *)(matrix + 8);
      if (uVar8 != 0) {
        uVar7 = 0;
        do {
          bVar10 = *(char *)(uVar7 + uVar8 * uVar4 + *(long *)(matrix + 0x10)) == '\x01';
          local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] =
               local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] | bVar10;
          pbVar1 = (byte *)(CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar7);
          *pbVar1 = *pbVar1 | bVar10;
          uVar7 = uVar7 + 1;
          uVar8 = *(ulong *)(matrix + 8);
        } while (uVar7 < uVar8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)matrix);
  }
  local_78 = "where the following matchers don\'t match any elements:\n";
  pcVar5 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,
                             local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start._0_1_);
  if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish == pcVar5) {
    bVar10 = true;
  }
  else {
    bVar10 = true;
    uVar4 = 0;
    do {
      if (pcVar5[uVar4] == '\0') {
        if (*(long *)(listener + 8) != 0) {
          pMVar6 = MatchResultListener::operator<<(listener,&local_78);
          pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x17f5ac);
          if (*(ulong *)(pMVar6 + 8) != 0) {
            std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar6 + 8));
          }
          MatchResultListener::operator<<(pMVar6,(char (*) [3])0x17e3b1);
          plVar2 = *(long **)(*(long *)this + uVar4 * 8);
          (**(code **)(*plVar2 + 0x10))(plVar2,*(undefined8 *)(listener + 8));
          local_78 = ",\n";
        }
        bVar10 = false;
      }
      uVar4 = uVar4 + 1;
      pcVar5 = (pointer)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_1_);
    } while (uVar4 < (ulong)((long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pcVar5));
  }
  local_78 = "where the following elements don\'t match any matchers:\n";
  local_70 = "\nand ";
  if (bVar10) {
    local_70 = "";
  }
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar9 = 8;
    uVar4 = 0;
    do {
      if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar4] == '\0') {
        if (*(long *)(listener + 8) != 0) {
          pMVar6 = MatchResultListener::operator<<(listener,&local_70);
          pMVar6 = MatchResultListener::operator<<(pMVar6,&local_78);
          pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [10])0x17f593);
          if (*(ulong *)(pMVar6 + 8) != 0) {
            std::ostream::_M_insert<unsigned_long>(*(ulong *)(pMVar6 + 8));
          }
          pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [3])0x17e3b1);
          if (*(ostream **)(pMVar6 + 8) != (ostream *)0x0) {
            pbVar3 = (local_38->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      (*(ostream **)(pMVar6 + 8),*(char **)((long)pbVar3 + lVar9 + -8),
                       *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar9));
          }
          local_78 = ",\n";
          local_70 = "";
        }
        bVar10 = false;
      }
      uVar4 = uVar4 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar4 < (ulong)((long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start));
  }
  if ((void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_68.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar10;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::
VerifyAllElementsAndMatchersAreMatched(
    const ::std::vector<string>& element_printouts,
    const MatchMatrix& matrix,
    MatchResultListener* listener) const {
  bool result = true;
  ::std::vector<char> element_matched(matrix.LhsSize(), 0);
  ::std::vector<char> matcher_matched(matrix.RhsSize(), 0);

  for (size_t ilhs = 0; ilhs < matrix.LhsSize(); ilhs++) {
    for (size_t irhs = 0; irhs < matrix.RhsSize(); irhs++) {
      char matched = matrix.HasEdge(ilhs, irhs);
      element_matched[ilhs] |= matched;
      matcher_matched[irhs] |= matched;
    }
  }

  {
    const char* sep =
        "where the following matchers don't match any elements:\n";
    for (size_t mi = 0; mi < matcher_matched.size(); ++mi) {
      if (matcher_matched[mi])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << sep << "matcher #" << mi << ": ";
        matcher_describers_[mi]->DescribeTo(listener->stream());
        sep = ",\n";
      }
    }
  }

  {
    const char* sep =
        "where the following elements don't match any matchers:\n";
    const char* outer_sep = "";
    if (!result) {
      outer_sep = "\nand ";
    }
    for (size_t ei = 0; ei < element_matched.size(); ++ei) {
      if (element_matched[ei])
        continue;
      result = false;
      if (listener->IsInterested()) {
        *listener << outer_sep << sep << "element #" << ei << ": "
                  << element_printouts[ei];
        sep = ",\n";
        outer_sep = "";
      }
    }
  }
  return result;
}